

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O1

int QGregorianCalendar::yearStartWeekDay(int year)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  iVar1 = year - (year >> 0x1f);
  uVar2 = iVar1 - 0x321;
  if ((int)uVar2 < 0) {
    iVar5 = iVar1 + -0x31d;
    if (-1 < iVar1 + -800) {
      iVar5 = iVar1 + -800;
    }
    uVar4 = (iVar5 >> 2) - 1;
  }
  else {
    uVar4 = uVar2 >> 2;
  }
  if ((int)uVar2 < 0) {
    uVar6 = (iVar1 + -800) / 100 - 1;
  }
  else {
    uVar6 = uVar2 / 100;
  }
  if ((int)uVar2 < 0) {
    uVar3 = (iVar1 + -800) / 400 - 1;
  }
  else {
    uVar3 = uVar2 / 400;
  }
  uVar3 = ((uVar4 + uVar2) - uVar6) + uVar3;
  if ((int)uVar3 < 0) {
    iVar1 = (int)((ulong)((long)(int)(uVar3 + 1) * -0x6db6db6d) >> 0x20) + uVar3 + 1;
    uVar3 = ((iVar1 >> 2) - (iVar1 >> 0x1f)) * -7 + uVar3 + 7;
  }
  else {
    uVar3 = uVar3 % 7;
  }
  return uVar3 + 1;
}

Assistant:

int QGregorianCalendar::yearStartWeekDay(int year)
{
    // Equivalent to weekDayOfJulian(julianForParts({year, 1, 1})
    const int y = year - (year < 0 ? 800 : 801);
    return qMod<7>(y + qDiv<4>(y) - qDiv<100>(y) + qDiv<400>(y)) + 1;
}